

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::setupWeights(SPxSteepPR<double> *this,Type type)

{
  VectorBase<double> *this_00;
  VectorBase<double> *this_01;
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  SPxOut *pSVar3;
  SVSetBase<double> *pSVar4;
  Item *pIVar5;
  DataKey *pDVar6;
  char cVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  long lVar12;
  pointer pdVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  Nonzero<double> *pNVar17;
  int iVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Verbosity old_verbosity;
  shared_ptr<soplex::Tolerances> local_98;
  undefined4 local_84;
  SSVectorBase<double> local_80;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  this_00 = &pSVar2->weights;
  this_01 = &pSVar2->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      iVar16 = 0;
      iVar18 = 0;
      if (pSVar2->weightsAreSetup != false) {
        iVar18 = (pSVar2->thecovectors->set).thenum;
        iVar16 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar2->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar18 < iVar16) {
          iVar16 = iVar18;
        }
        iVar1 = (pSVar2->thevectors->set).thenum;
        iVar18 = (int)((ulong)((long)(pSVar2->weights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar2->weights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar1 < iVar18) {
          iVar18 = iVar1;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_01->val,(long)(pSVar2->thecovectors->set).thenum);
      auVar10 = _DAT_003581b0;
      auVar9 = _DAT_003581a0;
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      iVar1 = (pSVar2->thecovectors->set).thenum;
      lVar12 = (long)iVar1;
      if (iVar16 < iVar1) {
        lVar15 = (lVar12 - iVar16) + -1;
        auVar21._8_4_ = (int)lVar15;
        auVar21._0_8_ = lVar15;
        auVar21._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar13 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12 + -1;
        uVar14 = 0;
        auVar21 = auVar21 ^ _DAT_003581b0;
        do {
          auVar25._8_4_ = (int)uVar14;
          auVar25._0_8_ = uVar14;
          auVar25._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = (auVar25 | auVar9) ^ auVar10;
          if ((bool)(~(auVar24._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar24._0_4_ ||
                      auVar21._4_4_ < auVar24._4_4_) & 1)) {
            *pdVar13 = 2.0;
          }
          if ((auVar24._12_4_ != auVar21._12_4_ || auVar24._8_4_ <= auVar21._8_4_) &&
              auVar24._12_4_ <= auVar21._12_4_) {
            pdVar13[-1] = 2.0;
          }
          uVar14 = uVar14 + 2;
          pdVar13 = pdVar13 + -2;
        } while (((lVar12 - iVar16) + 1U & 0xfffffffffffffffe) != uVar14);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_00->val,(long)(pSVar2->thevectors->set).thenum);
      auVar10 = _DAT_003581b0;
      auVar9 = _DAT_003581a0;
      iVar16 = (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum;
      lVar12 = (long)iVar16;
      if (iVar18 < iVar16) {
        lVar15 = (lVar12 - iVar18) + -1;
        auVar22._8_4_ = (int)lVar15;
        auVar22._0_8_ = lVar15;
        auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar13 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12 + -1;
        uVar14 = 0;
        auVar22 = auVar22 ^ _DAT_003581b0;
        do {
          auVar26._8_4_ = (int)uVar14;
          auVar26._0_8_ = uVar14;
          auVar26._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = (auVar26 | auVar9) ^ auVar10;
          if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                      auVar22._4_4_ < auVar24._4_4_) & 1)) {
            *pdVar13 = 1.0;
          }
          if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
              auVar24._12_4_ <= auVar22._12_4_) {
            pdVar13[-1] = 1.0;
          }
          uVar14 = uVar14 + 2;
          pdVar13 = pdVar13 + -2;
        } while (((lVar12 - iVar18) + 1U & 0xfffffffffffffffe) != uVar14);
      }
    }
    else {
      iVar18 = 0;
      if (pSVar2->weightsAreSetup != false) {
        iVar16 = (pSVar2->thecovectors->set).thenum;
        iVar18 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar2->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar16 < iVar18) {
          iVar18 = iVar16;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_01->val,(long)(pSVar2->thecovectors->set).thenum);
      auVar10 = _DAT_003581b0;
      auVar9 = _DAT_003581a0;
      iVar16 = (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
      lVar12 = (long)iVar16;
      if (iVar18 < iVar16) {
        lVar15 = (lVar12 - iVar18) + -1;
        auVar20._8_4_ = (int)lVar15;
        auVar20._0_8_ = lVar15;
        auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar13 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12 + -1;
        uVar14 = 0;
        auVar20 = auVar20 ^ _DAT_003581b0;
        do {
          auVar23._8_4_ = (int)uVar14;
          auVar23._0_8_ = uVar14;
          auVar23._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = (auVar23 | auVar9) ^ auVar10;
          if ((bool)(~(auVar24._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar24._0_4_ ||
                      auVar20._4_4_ < auVar24._4_4_) & 1)) {
            *pdVar13 = 1.0;
          }
          if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
              auVar24._12_4_ <= auVar20._12_4_) {
            pdVar13[-1] = 1.0;
          }
          uVar14 = uVar14 + 2;
          pdVar13 = pdVar13 + -2;
        } while (((lVar12 - iVar18) + 1U & 0xfffffffffffffffe) != uVar14);
      }
    }
  }
  else {
    pSVar3 = pSVar2->spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (2 < (int)pSVar3->m_verbosity)) {
      local_84 = 3;
      local_80.super_IdxSet._vptr_IdxSet._0_4_ = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 " --- initializing steepest edge multipliers",0x2b);
      cVar7 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      pSVar3 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_80);
    }
    std::vector<double,_std::allocator<double>_>::resize
              (&this_01->val,
               (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
    auVar10 = _DAT_003581b0;
    auVar9 = _DAT_003581a0;
    if (type == ENTER) {
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      iVar18 = (pSVar2->thecovectors->set).thenum;
      lVar12 = (long)iVar18;
      if (0 < lVar12) {
        lVar15 = lVar12 + -1;
        auVar24._8_4_ = (int)lVar15;
        auVar24._0_8_ = lVar15;
        auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar13 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12 + -1;
        uVar14 = 0;
        auVar24 = auVar24 ^ _DAT_003581b0;
        do {
          auVar27._8_4_ = (int)uVar14;
          auVar27._0_8_ = uVar14;
          auVar27._12_4_ = (int)(uVar14 >> 0x20);
          auVar27 = (auVar27 | auVar9) ^ auVar10;
          if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                      auVar24._4_4_ < auVar27._4_4_) & 1)) {
            *pdVar13 = 1.0;
          }
          if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
              auVar27._12_4_ <= auVar24._12_4_) {
            pdVar13[-1] = 1.0;
          }
          uVar14 = uVar14 + 2;
          pdVar13 = pdVar13 + -2;
        } while ((iVar18 + 1U & 0xfffffffe) != uVar14);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_00->val,(long)(pSVar2->thevectors->set).thenum);
      pSVar4 = ((this->super_SPxPricer<double>).thesolver)->thevectors;
      lVar12 = (long)(pSVar4->set).thenum;
      if (0 < lVar12) {
        pIVar5 = (pSVar4->set).theitem;
        pDVar6 = (pSVar4->set).thekey;
        pdVar13 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar18 = pDVar6[lVar12 + -1].idx;
          iVar16 = pIVar5[iVar18].data.super_SVectorBase<double>.memused;
          dVar19 = 1.0;
          if (iVar16 != 0) {
            pNVar17 = pIVar5[iVar18].data.super_SVectorBase<double>.m_elem;
            dVar19 = 0.0;
            do {
              pdVar8 = &pNVar17->val;
              pNVar17 = pNVar17 + 1;
              dVar19 = dVar19 + *pdVar8 * *pdVar8;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
            dVar19 = dVar19 + 1.0;
          }
          pdVar13[lVar12 + -1] = dVar19;
          bVar11 = 1 < lVar12;
          lVar12 = lVar12 + -1;
        } while (bVar11);
      }
    }
    else {
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      iVar18 = (pSVar2->thecovectors->set).thenum;
      local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pSVar2->super_SPxLPBase<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (pSVar2->super_SPxLPBase<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SSVectorBase<double>::SSVectorBase(&local_80,iVar18,&local_98);
      if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      lVar12 = (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
      if (0 < lVar12) {
        lVar15 = lVar12 + 1;
        lVar12 = lVar12 << 5;
        do {
          bVar11 = SPxSolverBase<double>::isTimeLimitReached
                             ((this->super_SPxPricer<double>).thesolver,false);
          if (bVar11) break;
          pSVar2 = (this->super_SPxPricer<double>).thesolver;
          SPxBasisBase<double>::coSolve
                    (&pSVar2->super_SPxBasisBase<double>,&local_80,
                     (SVectorBase<double> *)
                     ((long)&(pSVar2->unitVecs).data.
                             super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].super_SVectorBase<double>
                             .m_elem + lVar12));
          dVar19 = SSVectorBase<double>::length2(&local_80);
          (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + -2] = dVar19;
          lVar15 = lVar15 + -1;
          lVar12 = lVar12 + -0x20;
        } while (1 < lVar15);
      }
      SSVectorBase<double>::~SSVectorBase(&local_80);
    }
  }
  ((this->super_SPxPricer<double>).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}